

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compoundfile_stream_and_dir.hpp
# Opt level: O2

char __thiscall CompoundFile::Stream::getByte(Stream *this)

{
  char cVar1;
  reference pvVar2;
  
  cVar1 = -1;
  if (this->m_bytesReaded <= this->m_streamSize) {
    if (this->m_sectorBytesReaded == this->m_sectorSize) {
      this->m_sectorBytesReaded = 0;
      seekToNextSector(this);
    }
    pvVar2 = std::vector<char,_std::allocator<char>_>::at(&this->m_buf,(long)this->m_pos);
    cVar1 = *pvVar2;
    this->m_sectorBytesReaded = this->m_sectorBytesReaded + 1;
    this->m_bytesReaded = this->m_bytesReaded + 1;
    this->m_pos = this->m_pos + 1;
  }
  return cVar1;
}

Assistant:

inline char
Stream::getByte()
{
	if( m_bytesReaded > m_streamSize )
		return 0xFFu;

	if( m_sectorBytesReaded == m_sectorSize )
	{
		m_sectorBytesReaded = 0;

		seekToNextSector();
	}

	const auto ch = m_buf.at( m_pos );

	++m_sectorBytesReaded;
	++m_bytesReaded;
	++m_pos;

	return ch;
}